

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

FOTermFlattened * FOTermFlattened::variable(FOTermFlattened *__return_storage_ptr__,string *vname)

{
  (__return_storage_ptr__->params).super__Vector_base<Register,_std::allocator<Register>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->params).super__Vector_base<Register,_std::allocator<Register>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->params).super__Vector_base<Register,_std::allocator<Register>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->tag = Variable;
  if ((byte)(*(vname->_M_dataplus)._M_p + 0xbfU) < 0x1a) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
    return __return_storage_ptr__;
  }
  __assert_fail("vname[0] >= \'A\' && vname[0] <= \'Z\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                ,0x1b5,"static FOTermFlattened FOTermFlattened::variable(std::string)");
}

Assistant:

static FOTermFlattened variable(std::string vname) {
        FOTermFlattened t;
        t.tag = FOTermTag::Variable;
        // should be capital
        assert(vname[0] >= 'A' && vname[0] <= 'Z');
        t.name = vname;
        return t;
    }